

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     texture_gather_sampler_2d_array_shadow(NegativeTestContext *ctx)

{
  ShaderType shaderType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  bool bVar1;
  char *__s;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  string shaderSource;
  _Alloc_hider _Var5;
  size_type sVar6;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 uVar7;
  undefined8 in_stack_ffffffffffffff20;
  allocator<char> local_d1;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  _Var5._M_p = &stack0xffffffffffffff18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff08,"textureGrad - sampler2DArrayShadow","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff08);
  if (_Var5._M_p != &stack0xffffffffffffff18) {
    operator_delete(_Var5._M_p,in_stack_ffffffffffffff18 + 1);
  }
  lVar4 = 0;
  do {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar4);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_d1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c79853);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        uVar7 = *psVar3;
        in_stack_ffffffffffffff20 = plVar2[3];
        _Var5._M_p = &stack0xffffffffffffff18;
      }
      else {
        uVar7 = *psVar3;
        _Var5._M_p = (pointer)*plVar2;
      }
      sVar6 = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff08);
      if (_Var5._M_p != &stack0xffffffffffffff18) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xffffffffffffff08,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x32,TYPE_FLOAT,TYPE_LAST,
                 (DataType)_Var5._M_p);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>((string *)local_70,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_00._M_string_length = sVar6;
      shaderSource_00._M_dataplus._M_p = _Var5._M_p;
      shaderSource_00.field_2._M_allocated_capacity = uVar7;
      shaderSource_00.field_2._8_8_ = in_stack_ffffffffffffff20;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_70[0],shaderSource_00);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (_Var5._M_p != &stack0xffffffffffffff18) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xffffffffffffff08,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x32,TYPE_FLOAT_VEC3,TYPE_INT,
                 (DataType)_Var5._M_p);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>((string *)local_90,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_01._M_string_length = sVar6;
      shaderSource_01._M_dataplus._M_p = _Var5._M_p;
      shaderSource_01.field_2._M_allocated_capacity = uVar7;
      shaderSource_01.field_2._8_8_ = in_stack_ffffffffffffff20;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_90[0],shaderSource_01);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if (_Var5._M_p != &stack0xffffffffffffff18) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xffffffffffffff08,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x32,TYPE_FLOAT,TYPE_FLOAT,
                 (DataType)_Var5._M_p);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>((string *)local_b0,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_02._M_string_length = sVar6;
      shaderSource_02._M_dataplus._M_p = _Var5._M_p;
      shaderSource_02.field_2._M_allocated_capacity = uVar7;
      shaderSource_02.field_2._8_8_ = in_stack_ffffffffffffff20;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_b0[0],shaderSource_02);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if (_Var5._M_p != &stack0xffffffffffffff18) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xffffffffffffff08,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x2c,TYPE_FLOAT_VEC3,TYPE_FLOAT,
                 (DataType)_Var5._M_p);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char*>((string *)local_d0,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_03._M_string_length = sVar6;
      shaderSource_03._M_dataplus._M_p = _Var5._M_p;
      shaderSource_03.field_2._M_allocated_capacity = uVar7;
      shaderSource_03.field_2._8_8_ = in_stack_ffffffffffffff20;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_d0[0],shaderSource_03);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      if (_Var5._M_p != &stack0xffffffffffffff18) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestContext::endSection(ctx);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x18);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_gather_sampler_2d_array_shadow (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGrad - sampler2DArrayShadow");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, glu::TYPE_FLOAT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}